

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O1

int IoCommandReadTruth(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  Abc_Ntk_t *pNtk;
  FILE *__s;
  size_t __size;
  
  Extra_UtilGetoptReset();
  bVar1 = true;
  while (iVar2 = Extra_UtilGetopt(argc,argv,"xh"), iVar2 == 0x78) {
    bVar1 = (bool)(bVar1 ^ 1);
  }
  if ((iVar2 == -1) && (globalUtilOptind + 1 == argc)) {
    if (bVar1) {
      pcVar3 = Abc_SopFromTruthHex(argv[globalUtilOptind]);
    }
    else {
      pcVar3 = Abc_SopFromTruthBin(argv[globalUtilOptind]);
    }
    if (pcVar3 != (char *)0x0) {
      if (*pcVar3 != '\0') {
        pNtk = Abc_NtkCreateWithNode(pcVar3);
        free(pcVar3);
        if (pNtk != (Abc_Ntk_t *)0x0) {
          Abc_FrameReplaceCurrentNetwork(pAbc,pNtk);
          Abc_FrameClearVerifStatus(pAbc);
          return 0;
        }
        __s = (FILE *)pAbc->Err;
        pcVar3 = "Deriving the network has failed.\n";
        __size = 0x21;
        goto LAB_002c1a6a;
      }
      free(pcVar3);
    }
    __s = (FILE *)pAbc->Err;
    pcVar3 = "Reading truth table has failed.\n";
    __size = 0x20;
  }
  else {
    fwrite("usage: read_truth [-xh] <truth>\n",0x20,1,(FILE *)pAbc->Err);
    fwrite("\t         creates network with node having given truth table\n",0x3d,1,
           (FILE *)pAbc->Err);
    pcVar3 = "hex";
    if (!bVar1) {
      pcVar3 = "bin";
    }
    fprintf((FILE *)pAbc->Err,
            "\t-x     : toggles between bin and hex representation [default = %s]\n",pcVar3);
    fwrite("\t-h     : prints the command summary\n",0x25,1,(FILE *)pAbc->Err);
    __s = (FILE *)pAbc->Err;
    pcVar3 = "\ttruth  : truth table with most signficant bit first (e.g. 1000 for AND(a,b))\n";
    __size = 0x4e;
  }
LAB_002c1a6a:
  fwrite(pcVar3,__size,1,__s);
  return 1;
}

Assistant:

int IoCommandReadTruth( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk;
    char * pSopCover;
    int fHex;
    int c;

    fHex = 1;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "xh" ) ) != EOF )
    {
        switch ( c )
        {
            case 'x':
                fHex ^= 1;
                break;
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }

    if ( argc != globalUtilOptind + 1 )
    {
        goto usage;
    }

    // convert truth table to SOP
    if ( fHex )
        pSopCover = Abc_SopFromTruthHex(argv[globalUtilOptind]);
    else
        pSopCover = Abc_SopFromTruthBin(argv[globalUtilOptind]);
    if ( pSopCover == NULL || pSopCover[0] == 0 )
    {
        ABC_FREE( pSopCover );
        fprintf( pAbc->Err, "Reading truth table has failed.\n" );
        return 1;
    }

    pNtk = Abc_NtkCreateWithNode( pSopCover );
    ABC_FREE( pSopCover );
    if ( pNtk == NULL )
    {
        fprintf( pAbc->Err, "Deriving the network has failed.\n" );
        return 1;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtk );
    Abc_FrameClearVerifStatus( pAbc );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: read_truth [-xh] <truth>\n" );
    fprintf( pAbc->Err, "\t         creates network with node having given truth table\n" );
    fprintf( pAbc->Err, "\t-x     : toggles between bin and hex representation [default = %s]\n", fHex? "hex":"bin" );
    fprintf( pAbc->Err, "\t-h     : prints the command summary\n" );
    fprintf( pAbc->Err, "\ttruth  : truth table with most signficant bit first (e.g. 1000 for AND(a,b))\n" );
    return 1;
}